

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

DirectionCone * __thiscall pbrt::Disk::NormalBounds(Disk *this)

{
  long in_RSI;
  DirectionCone *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  Normal3<float> NVar4;
  Normal3f n;
  Normal3<float> *in_stack_00000088;
  Transform *in_stack_00000090;
  DirectionCone *this_00;
  undefined1 auVar3 [56];
  
  auVar3 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  this_00 = in_RDI;
  Normal3<float>::Normal3
            ((Normal3<float> *)in_RDI,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0);
  NVar4 = Transform::operator()(in_stack_00000090,in_stack_00000088);
  auVar1._0_8_ = NVar4.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar1._8_56_ = auVar3;
  vmovlpd_avx(auVar1._0_16_);
  if ((*(byte *)(in_RSI + 0x10) & 1) != 0) {
    NVar4 = Tuple3<pbrt::Normal3,_float>::operator-((Tuple3<pbrt::Normal3,_float> *)this_00);
    auVar2._0_8_ = NVar4.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar2._8_56_ = auVar3;
    vmovlpd_avx(auVar2._0_16_);
  }
  Vector3<float>::Vector3<float>(&this_00->w,(Normal3<float> *)in_RDI);
  DirectionCone::DirectionCone(this_00,&in_RDI->w);
  return this_00;
}

Assistant:

DirectionCone Disk::NormalBounds() const {
    Normal3f n = (*renderFromObject)(Normal3f(0, 0, 1));
    if (reverseOrientation)
        n = -n;
    return DirectionCone(Vector3f(n));
}